

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
write_bignum(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,bigint *n
            )

{
  binary_stream_sink *d_first;
  pointer puVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  pointer puVar3;
  ulong val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int signum;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  bVar2 = jsoncons::operator<(n,0);
  if (bVar2) {
    basic_bigint<std::allocator<unsigned_char>_>::operator-(&local_48,n);
    operator-((basic_bigint<std::allocator<unsigned_char>_> *)&data,&local_48,1);
    basic_bigint<std::allocator<unsigned_char>_>::operator=
              (n,(basic_bigint<std::allocator<unsigned_char>_> *)&data);
    basic_bigint<std::allocator<unsigned_char>_>::destroy
              ((basic_bigint<std::allocator<unsigned_char>_> *)&data);
    basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_48);
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
            ((basic_bigint<std::allocator<unsigned_char>> *)n,&signum,&data);
  val = (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  d_first = &this->sink_;
  binary_stream_sink::push_back(d_first,bVar2 | 0xc2);
  if (val < 0x18) {
    val = (ulong)(byte)((byte)val | 0x40);
  }
  else {
    if (0xff < val) {
      if (val < 0x10000) {
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ('Y',(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
        binary::
        native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ((unsigned_short)val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
      }
      else if (val >> 0x20 == 0) {
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ('Z',(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
        binary::
        native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ((uint)val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
      }
      else {
        binary::
        native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ('[',(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
        binary::
        native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
      }
      goto LAB_00212793;
    }
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ('X',(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
  }
  binary::
  native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
            ((uchar)val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
LAB_00212793:
  puVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    binary_stream_sink::push_back(&this->sink_,*puVar3);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void write_bignum(bigint& n)
    {
        bool is_neg = n < 0;
        if (is_neg)
        {
            n = - n -1;
        }

        int signum;
        std::vector<uint8_t> data;
        n.write_bytes_be(signum, data);
        std::size_t length = data.size();

        if (is_neg)
        {
            write_tag(3);
        }
        else
        {
            write_tag(2);
        }

        if (length <= 0x17)
        {
            // fixstr stores a byte array whose length is upto 31 bytes
            binary::native_to_big(static_cast<uint8_t>(0x40 + length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x58), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint8_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x59), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint16_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (length <= 0xffffffff)
        {
            binary::native_to_big(static_cast<uint8_t>(0x5a), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint32_t>(length), 
                                  std::back_inserter(sink_));
        }
        else if (uint64_t(length) <= (std::numeric_limits<std::uint64_t>::max)())
        {
            binary::native_to_big(static_cast<uint8_t>(0x5b), 
                                  std::back_inserter(sink_));
            binary::native_to_big(static_cast<uint64_t>(length), 
                                  std::back_inserter(sink_));
        }

        for (auto c : data)
        {
            sink_.push_back(c);
        }
    }